

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O1

void ncnn_mat_destroy(ncnn_mat_t mat)

{
  int *piVar1;
  
  if (mat != (ncnn_mat_t)0x0) {
    piVar1 = *(int **)(mat + 8);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(mat + 0x20) == (long *)0x0) {
          if (*(void **)mat != (void *)0x0) {
            free(*(void **)mat);
          }
        }
        else {
          (**(code **)(**(long **)(mat + 0x20) + 0x18))();
        }
      }
    }
    *(undefined8 *)(mat + 0x40) = 0;
    *(undefined8 *)mat = 0;
    *(undefined8 *)(mat + 8) = 0;
    *(undefined8 *)(mat + 0xc) = 0;
    *(undefined8 *)(mat + 0x14) = 0;
    *(undefined8 *)(mat + 0x28) = 0;
    *(undefined8 *)(mat + 0x30) = 0;
    *(undefined4 *)(mat + 0x38) = 0;
    operator_delete(mat,0x48);
    return;
  }
  return;
}

Assistant:

void ncnn_mat_destroy(ncnn_mat_t mat)
{
    delete (Mat*)mat;
}